

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.h
# Opt level: O0

void state_machine::transition::
     make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_make_table_from_transition_args_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>>
               (identity<state_machine::transition::detail::empty> *param_1,
               anon_class_1_0_00000001 *param_2)

{
  anon_class_1_0_00000001 local_23 [2];
  guard_always local_21;
  anon_class_1_0_00000001 updated_action;
  anon_class_1_0_00000001 *paStack_20;
  guard_always updated_guard;
  anon_class_1_0_00000001 *action_local;
  identity<state_machine::transition::detail::empty> *guard_local;
  
  paStack_20 = param_2;
  detail::
  create_guard_if_empty<const_state_machine::containers::basic::identity<state_machine::transition::detail::empty>_&,_0>
            (param_1);
  detail::
  create_action_if_empty<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:111:92),_0>
            (paStack_20);
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition_table.cc:111:92),_state_machine::transition::State<(anonymous_namespace)::s2>_>
  ::Transition((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:111:92),_state_machine::transition::State<(anonymous_namespace)::s2>_>
                *)((long)&guard_local + 7),&local_21,local_23);
  return;
}

Assistant:

constexpr auto make_transition(Source, Event, Guard&& guard, Action&& action, Destination) {
    auto updated_guard = detail::create_guard_if_empty(std::forward<Guard>(guard));
    using UpdatedGuard = decltype(updated_guard);

    auto updated_action = detail::create_action_if_empty(std::forward<Action>(action));
    using UpdatedAction = decltype(updated_action);

    using UpdatedDestination = std::
        conditional_t<detail::is_empty_placeholder<Destination>::value, State<void>, Destination>;

    return Transition<Source, Event, UpdatedGuard, UpdatedAction, UpdatedDestination>{
        std::forward<UpdatedGuard>(updated_guard), std::forward<UpdatedAction>(updated_action)};
}